

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall
google::LogDestination::LogDestination
          (LogDestination *this,LogSeverity severity,char *base_filename)

{
  char *base_filename_local;
  LogSeverity severity_local;
  LogDestination *this_local;
  
  anon_unknown_8::LogFileObject::LogFileObject(&this->fileobject_,severity,base_filename);
  this->logger_ = (Logger *)this;
  return;
}

Assistant:

LogDestination::LogDestination(LogSeverity severity, const char* base_filename)
    : fileobject_(severity, base_filename), logger_(&fileobject_) {}